

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::readBasis(Highs *this,string *filename)

{
  HighsLogOptions *log_options;
  bool bVar1;
  HighsStatus HVar2;
  allocator local_129;
  string local_128;
  string local_108;
  HighsBasis read_basis;
  HighsLogOptions local_88;
  
  logHeader(this);
  HighsBasis::HighsBasis(&read_basis,&this->basis_);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  HighsLogOptions::HighsLogOptions(&local_88,log_options);
  std::__cxx11::string::string((string *)&local_108,(string *)filename);
  HVar2 = readBasisFile(log_options,&read_basis,&local_108);
  std::__cxx11::string::string((string *)&local_128,"readBasis",&local_129);
  HVar2 = interpretCallStatus(&local_88,HVar2,kOk,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::_Function_base::~_Function_base(&local_88.user_callback.super__Function_base);
  if (HVar2 == kOk) {
    bVar1 = isBasisConsistent(&(this->model_).lp_,&read_basis);
    if (bVar1) {
      HighsBasis::operator=(&this->basis_,&read_basis);
      (this->basis_).valid = true;
      (this->basis_).useful = true;
      HVar2 = kOk;
      newHighsBasis(this);
    }
    else {
      highsLogUser(log_options,kError,"readBasis: invalid basis\n");
      HVar2 = kError;
    }
  }
  HighsBasis::~HighsBasis(&read_basis);
  return HVar2;
}

Assistant:

HighsStatus Highs::readBasis(const std::string& filename) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  // Try to read basis file into read_basis
  HighsBasis read_basis = basis_;
  return_status = interpretCallStatus(
      options_.log_options,
      readBasisFile(options_.log_options, read_basis, filename), return_status,
      "readBasis");
  if (return_status != HighsStatus::kOk) return return_status;
  // Basis read OK: check whether it's consistent with the LP
  if (!isBasisConsistent(model_.lp_, read_basis)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "readBasis: invalid basis\n");
    return HighsStatus::kError;
  }
  // Update the HiGHS basis and invalidate any simplex basis for the model
  basis_ = read_basis;
  basis_.valid = true;
  basis_.useful = true;
  // Follow implications of a new HiGHS basis
  newHighsBasis();
  // Can't use returnFromHighs since...
  return HighsStatus::kOk;
}